

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glucose.cpp
# Opt level: O2

lbool __thiscall Gluco::Solver::solve_(Solver *this)

{
  bool bVar1;
  int i;
  int iVar2;
  ulong uVar3;
  long lVar4;
  int *piVar5;
  ulong uVar6;
  int i_1;
  double dVar7;
  double dVar8;
  lbool status;
  timespec ts;
  
  if ((this->incremental != 0) && (this->certifiedUNSAT == true)) {
    puts("Can not use incremental and certified unsat in the same time");
    exit(-1);
  }
  if ((this->model).data != (lbool *)0x0) {
    (this->model).sz = 0;
  }
  if ((this->conflict).data != (Lit *)0x0) {
    (this->conflict).sz = 0;
  }
  if (this->ok == false) {
    status.value = '\x01';
  }
  else {
    dVar7 = cpuTime();
    this->solves = this->solves + 1;
    status.value = '\x02';
    if ((this->incremental == 0) && (0 < this->verbosity)) {
      puts(
          "c ========================================[ MAGIC CONSTANTS ]=============================================="
          );
      puts(
          "c | Constants are supposed to work well together :-)                                                      |"
          );
      puts(
          "c | however, if you find better choices, please let us known...                                           |"
          );
      puts(
          "c |-------------------------------------------------------------------------------------------------------|"
          );
      puts(
          "c |                                |                                |                                     |"
          );
      puts(
          "c | - Restarts:                    | - Reduce Clause DB:            | - Minimize Asserting:               |"
          );
      printf("c |   * LBD Queue    : %6d      |   * First     : %6d         |    * size < %3d                     |\n"
             ,(ulong)(uint)(this->lbdQueue).maxsize,(ulong)(uint)this->nbclausesbeforereduce,
             (ulong)(uint)this->lbSizeMinimizingClause);
      printf("c |   * Trail  Queue : %6d      |   * Inc       : %6d         |    * lbd  < %3d                     |\n"
             ,(ulong)(uint)(this->trailQueue).maxsize,(ulong)(uint)this->incReduceDB,
             (ulong)this->lbLBDMinimizingClause);
      printf("c |   * K            : %6.2f      |   * Special   : %6d         |                                     |\n"
             ,this->K,(ulong)(uint)this->specialIncReduceDB);
      printf("c |   * R            : %6.2f      |   * Protected :  (lbd)< %2d     |                                     |\n"
             ,this->R,(ulong)this->lbLBDFrozenClause);
      puts(
          "c |                                |                                |                                     |"
          );
      printf("c ==================================[ Search Statistics (every %6d conflicts) ]=========================\n"
             ,(ulong)(uint)this->verbEveryConflicts);
      puts(
          "c |                                                                                                       |"
          );
      puts(
          "c |          RESTARTS           |          ORIGINAL         |              LEARNT              | Progress |"
          );
      puts(
          "c |       NB   Blocked  Avg Cfc |    Vars  Clauses Literals |   Red   Learnts    LBD2  Removed |          |"
          );
      puts(
          "c ========================================================================================================="
          );
    }
    do {
      do {
        iVar2 = 2;
        bVar1 = lbool::operator==(&status,(lbool)0x2);
        if (!bVar1) goto LAB_004b7332;
        status = search(this,iVar2);
        bVar1 = withinBudget(this);
        if (((!bVar1) || (this->terminate_search_early != false)) ||
           ((this->pstop != (int *)0x0 && (*this->pstop != 0)))) goto LAB_004b7332;
      } while (this->nRuntimeLimit == 0);
      iVar2 = clock_gettime(3,(timespec *)&ts);
      uVar3 = 0xffffffffffffffff;
      if (-1 < iVar2) {
        uVar3 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
      }
    } while (uVar3 <= this->nRuntimeLimit);
LAB_004b7332:
    if ((this->incremental == 0) && (0 < this->verbosity)) {
      puts(
          "c ========================================================================================================="
          );
    }
    if (this->certifiedUNSAT == true) {
      bVar1 = lbool::operator==(&status,(lbool)0x1);
      if (bVar1) {
        fwrite("0\n",2,1,(FILE *)this->certifiedOutput);
      }
      fclose((FILE *)this->certifiedOutput);
    }
    bVar1 = lbool::operator==(&status,(lbool)0x0);
    if (bVar1) {
      vec<Gluco::lbool>::growTo(&this->model,(this->vardata).sz);
      for (lVar4 = 0; lVar4 < (this->vardata).sz; lVar4 = lVar4 + 1) {
        (this->model).data[lVar4].value = (this->assigns).data[lVar4].value;
      }
    }
    else {
      bVar1 = lbool::operator==(&status,(lbool)0x1);
      if ((bVar1) && ((this->conflict).sz == 0)) {
        this->ok = false;
      }
    }
    cancelUntil(this,0);
    dVar8 = cpuTime();
    bVar1 = lbool::operator==(&status,(lbool)0x0);
    if (bVar1) {
      this->nbSatCalls = this->nbSatCalls + 1;
      this->totalTime4Sat = this->totalTime4Sat + (dVar8 - dVar7);
    }
    iVar2 = 1;
    bVar1 = lbool::operator==(&status,(lbool)0x1);
    if (bVar1) {
      this->nbUnsatCalls = this->nbUnsatCalls + 1;
      this->totalTime4Unsat = (dVar8 - dVar7) + this->totalTime4Unsat;
    }
    if (this->pCnfFunc != (_func_int_void_ptr_int_int_ptr *)0x0) {
      if (this->terminate_search_early == false) {
        bVar1 = lbool::operator==(&status,(lbool)0x0);
        if (!bVar1) {
          bVar1 = lbool::operator==(&status,(lbool)0x1);
          iVar2 = bVar1 - 1;
        }
        piVar5 = (int *)0x0;
        bVar1 = lbool::operator==(&status,(lbool)0x0);
        if (bVar1) {
          uVar6 = (ulong)(this->vardata).sz;
          uVar3 = 0xffffffffffffffff;
          if (-1 < (long)uVar6) {
            uVar3 = uVar6 * 4;
          }
          piVar5 = (int *)operator_new__(uVar3);
          for (lVar4 = 0; lVar4 < (int)uVar6; lVar4 = lVar4 + 1) {
            bVar1 = lbool::operator==((this->model).data + lVar4,(lbool)0x0);
            piVar5[lVar4] = (uint)bVar1;
            uVar6 = (ulong)(uint)(this->vardata).sz;
          }
        }
        iVar2 = (*this->pCnfFunc)(this->pCnfMan,iVar2,piVar5);
        if (iVar2 != 0) {
          __assert_fail("callback_result == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/Glucose.cpp"
                        ,0x511,"lbool Gluco::Solver::solve_()");
        }
      }
      else {
        this->terminate_search_early = false;
      }
    }
  }
  return (lbool)status.value;
}

Assistant:

lbool Solver::solve_()
{

  if(incremental && certifiedUNSAT) {
    printf("Can not use incremental and certified unsat in the same time\n");
    exit(-1);
  }
    model.clear();
    conflict.clear();
    if (!ok) return l_False;
    double curTime = cpuTime();

    
    solves++;
            

    
    lbool   status        = l_Undef;
    if(!incremental && verbosity>=1) {
      printf("c ========================================[ MAGIC CONSTANTS ]==============================================\n");
      printf("c | Constants are supposed to work well together :-)                                                      |\n");
      printf("c | however, if you find better choices, please let us known...                                           |\n");
      printf("c |-------------------------------------------------------------------------------------------------------|\n");
    printf("c |                                |                                |                                     |\n"); 
    printf("c | - Restarts:                    | - Reduce Clause DB:            | - Minimize Asserting:               |\n");
    printf("c |   * LBD Queue    : %6d      |   * First     : %6d         |    * size < %3d                     |\n",lbdQueue.maxSize(),nbclausesbeforereduce,lbSizeMinimizingClause);
    printf("c |   * Trail  Queue : %6d      |   * Inc       : %6d         |    * lbd  < %3d                     |\n",trailQueue.maxSize(),incReduceDB,lbLBDMinimizingClause);
    printf("c |   * K            : %6.2f      |   * Special   : %6d         |                                     |\n",K,specialIncReduceDB);
    printf("c |   * R            : %6.2f      |   * Protected :  (lbd)< %2d     |                                     |\n",R,lbLBDFrozenClause);
    printf("c |                                |                                |                                     |\n"); 
printf("c ==================================[ Search Statistics (every %6d conflicts) ]=========================\n",verbEveryConflicts);
      printf("c |                                                                                                       |\n"); 

      printf("c |          RESTARTS           |          ORIGINAL         |              LEARNT              | Progress |\n");
      printf("c |       NB   Blocked  Avg Cfc |    Vars  Clauses Literals |   Red   Learnts    LBD2  Removed |          |\n");
      printf("c =========================================================================================================\n");
    }

    // Search:
    int curr_restarts = 0;
    while (status == l_Undef){
      status = search(0); // the parameter is useless in glucose, kept to allow modifications
        if (!withinBudget() || terminate_search_early || (pstop && *pstop)) break;
        if (nRuntimeLimit && Abc_Clock() > nRuntimeLimit)                   break;
        curr_restarts++;
    }

    if (!incremental && verbosity >= 1)
      printf("c =========================================================================================================\n");


    if (certifiedUNSAT){ // Want certified output
      if (status == l_False)
        fprintf(certifiedOutput, "0\n");
      fclose(certifiedOutput);
    }


    if (status == l_True){
        // Extend & copy model:
        model.growTo(nVars());
        for (int i = 0; i < nVars(); i++) model[i] = value(i);
    }else if (status == l_False && conflict.size() == 0)
        ok = false;

    cancelUntil(0);

    double finalTime = cpuTime();
    if(status==l_True) {
      nbSatCalls++; 
      totalTime4Sat +=(finalTime-curTime);
    }
    if(status==l_False) {
      nbUnsatCalls++; 
      totalTime4Unsat +=(finalTime-curTime);
    }

    // ABC callback
    if (pCnfFunc && !terminate_search_early) {// hack to avoid calling callback twise if the solver was terminated early
        int * pCex = NULL;
        int message = (status == l_True ? 1 : status == l_False ? 0 : -1);
        if (status == l_True) {
            pCex = new int[nVars()];
            for (int i = 0; i < nVars(); i++)
                pCex[i] = (model[i] == l_True);
        }
        
        int callback_result = pCnfFunc(pCnfMan, message, pCex);
        assert(callback_result == 0);
    }
    else if (pCnfFunc)
        terminate_search_early = false; // for next run

    return status;
}